

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O2

void mk_plugin_api_init(mk_server *server)

{
  plugin_api *ppVar1;
  
  ppVar1 = (plugin_api *)mk_mem_alloc_z(0x2c0);
  ppVar1->_error = mk_print;
  ppVar1->http_request_end = mk_plugin_http_request_end;
  ppVar1->http_request_error = mk_plugin_http_error;
  ppVar1->pointer_set = mk_ptr_set;
  ppVar1->pointer_print = mk_ptr_print;
  ppVar1->pointer_to_buf = mk_ptr_to_buf;
  ppVar1->plugin_load_symbol = mk_plugin_load_symbol;
  ppVar1->mem_alloc = mk_mem_alloc;
  ppVar1->mem_alloc_z = mk_mem_alloc_z;
  ppVar1->mem_realloc = mk_mem_realloc;
  ppVar1->mem_free = mk_mem_free;
  ppVar1->str_build = mk_string_build;
  ppVar1->str_dup = mk_string_dup;
  ppVar1->str_search = mk_string_search;
  ppVar1->str_search_n = mk_string_search_n;
  ppVar1->str_char_search = mk_string_char_search;
  ppVar1->str_copy_substr = mk_string_copy_substr;
  ppVar1->str_itop = mk_string_itop;
  ppVar1->str_split_line = mk_string_split_line;
  ppVar1->str_split_free = mk_string_split_free;
  ppVar1->file_to_buffer = mk_file_to_buffer;
  ppVar1->file_get_info = mk_file_get_info;
  ppVar1->header_prepare = mk_plugin_header_prepare;
  ppVar1->header_add = mk_plugin_header_add;
  ppVar1->header_get = mk_http_header_get;
  ppVar1->header_set_http_status = mk_header_set_http_status;
  ppVar1->channel_new = mk_channel_new;
  ppVar1->channel_flush = mk_channel_flush;
  ppVar1->channel_write = mk_channel_write;
  ppVar1->channel_append_stream = mk_channel_append_stream;
  ppVar1->iov_create = mk_iov_create;
  ppVar1->iov_realloc = mk_iov_realloc;
  ppVar1->iov_free = mk_iov_free;
  ppVar1->iov_free_marked = mk_iov_free_marked;
  ppVar1->iov_add = mk_iov_add;
  ppVar1->iov_set_entry = mk_iov_set_entry;
  ppVar1->iov_send = mk_iov_send;
  ppVar1->iov_print = mk_iov_print;
  ppVar1->ev_loop_create = mk_event_loop_create;
  ppVar1->ev_add = mk_event_add;
  ppVar1->ev_del = mk_event_del;
  ppVar1->ev_timeout_create = mk_event_timeout_create;
  ppVar1->ev_channel_create = mk_event_channel_create;
  ppVar1->ev_wait = mk_event_wait;
  ppVar1->ev_backend = mk_event_backend;
  ppVar1->mimetype_lookup = mk_mimetype_lookup;
  ppVar1->socket_cork_flag = mk_socket_set_cork_flag;
  ppVar1->socket_connect = mk_socket_connect;
  ppVar1->socket_open = mk_socket_open;
  ppVar1->socket_reset = mk_socket_reset;
  ppVar1->socket_set_tcp_fastopen = mk_socket_set_tcp_fastopen;
  ppVar1->socket_set_tcp_reuseport = mk_socket_set_tcp_reuseport;
  ppVar1->socket_set_tcp_nodelay = mk_socket_set_tcp_nodelay;
  ppVar1->socket_set_nonblocking = mk_socket_set_nonblocking;
  ppVar1->socket_create = mk_socket_create;
  ppVar1->socket_ip_str = mk_socket_ip_str;
  ppVar1->net_conn_create = mk_net_conn_create;
  ppVar1->config_create = mk_rconf_create;
  ppVar1->config_open = mk_rconf_open;
  ppVar1->config_free = mk_rconf_free;
  ppVar1->config_section_get = mk_rconf_section_get;
  ppVar1->config_section_get_key = mk_rconf_section_get_key;
  ppVar1->sched_loop = mk_sched_loop;
  ppVar1->sched_get_connection = mk_sched_get_connection;
  ppVar1->sched_event_free = mk_sched_event_free;
  ppVar1->sched_remove_client = mk_plugin_sched_remove_client;
  ppVar1->sched_worker_info = mk_plugin_sched_get_thread_conf;
  ppVar1->worker_spawn = mk_utils_worker_spawn;
  ppVar1->worker_rename = mk_utils_worker_rename;
  ppVar1->time_unix = mk_plugin_time_now_unix;
  ppVar1->time_to_gmt = mk_utils_utime2gmt;
  ppVar1->time_human = mk_plugin_time_now_human;
  ppVar1->stacktrace = mk_utils_stacktrace;
  ppVar1->kernel_version = mk_kernel_version;
  ppVar1->kernel_features_print = mk_kernel_features_print;
  ppVar1->plugins = &server->plugins;
  ppVar1->handler_param_get = mk_handler_param_get;
  server->api = ppVar1;
  return;
}

Assistant:

void mk_plugin_api_init(struct mk_server *server)
{
    struct plugin_api *api;

    /* Create an instance of the API */
    api = mk_mem_alloc_z(sizeof(struct plugin_api));

#ifndef _WIN32
    __builtin_prefetch(api);
#endif

    /* Setup and connections list */
    /* FIXME: api->config = server; */

    /* API plugins funcions */

    /* Error helper */
    api->_error = mk_print;

    /* HTTP callbacks */
    api->http_request_end = mk_plugin_http_request_end;
    api->http_request_error = mk_plugin_http_error;

    /* Memory callbacks */
    api->pointer_set = mk_ptr_set;
    api->pointer_print = mk_ptr_print;
    api->pointer_to_buf = mk_ptr_to_buf;
    api->plugin_load_symbol = mk_plugin_load_symbol;
    api->mem_alloc = mk_mem_alloc;
    api->mem_alloc_z = mk_mem_alloc_z;
    api->mem_realloc = mk_mem_realloc;
    api->mem_free = mk_mem_free;

    /* String Callbacks */
    api->str_build = mk_string_build;
    api->str_dup = mk_string_dup;
    api->str_search = mk_string_search;
    api->str_search_n = mk_string_search_n;
    api->str_char_search = mk_string_char_search;
    api->str_copy_substr = mk_string_copy_substr;
    api->str_itop = mk_string_itop;
    api->str_split_line = mk_string_split_line;
    api->str_split_free = mk_string_split_free;

    /* File Callbacks */
    api->file_to_buffer = mk_file_to_buffer;
    api->file_get_info = mk_file_get_info;

    /* HTTP Callbacks */
    api->header_prepare = mk_plugin_header_prepare;
    api->header_add = mk_plugin_header_add;
    api->header_get = mk_http_header_get;
    api->header_set_http_status = mk_header_set_http_status;

    /* Channels / Streams */
    api->channel_new   = mk_channel_new;
    api->channel_flush = mk_channel_flush;
    api->channel_write = mk_channel_write;
    api->channel_append_stream = mk_channel_append_stream;

    /* IOV callbacks */
    api->iov_create  = mk_iov_create;
    api->iov_realloc = mk_iov_realloc;
    api->iov_free = mk_iov_free;
    api->iov_free_marked = mk_iov_free_marked;
    api->iov_add =  mk_iov_add;
    api->iov_set_entry =  mk_iov_set_entry;
    api->iov_send =  mk_iov_send;
    api->iov_print =  mk_iov_print;

    /* events mechanism */
    api->ev_loop_create = mk_event_loop_create;
    api->ev_add = mk_event_add;
    api->ev_del = mk_event_del;
    api->ev_timeout_create = mk_event_timeout_create;
    api->ev_channel_create = mk_event_channel_create;
    api->ev_wait = mk_event_wait;
    api->ev_backend = mk_event_backend;

    /* Mimetype */
    api->mimetype_lookup = mk_mimetype_lookup;

    /* Socket callbacks */
    api->socket_cork_flag = mk_socket_set_cork_flag;
    api->socket_connect = mk_socket_connect;
    api->socket_open = mk_socket_open;
    api->socket_reset = mk_socket_reset;
    api->socket_set_tcp_fastopen = mk_socket_set_tcp_fastopen;
    api->socket_set_tcp_reuseport = mk_socket_set_tcp_reuseport;
    api->socket_set_tcp_nodelay = mk_socket_set_tcp_nodelay;
    api->socket_set_nonblocking = mk_socket_set_nonblocking;
    api->socket_create = mk_socket_create;
    api->socket_ip_str = mk_socket_ip_str;

    /* Async network */
    api->net_conn_create = mk_net_conn_create;

    /* Config Callbacks */
    api->config_create = mk_rconf_create;
    api->config_open = mk_rconf_open;
    api->config_free = mk_rconf_free;
    api->config_section_get = mk_rconf_section_get;
    api->config_section_get_key = mk_rconf_section_get_key;

    /* Scheduler and Event callbacks */
    api->sched_loop           = mk_sched_loop;
    api->sched_get_connection = mk_sched_get_connection;
    api->sched_event_free     = mk_sched_event_free;
    api->sched_remove_client  = mk_plugin_sched_remove_client;
    api->sched_worker_info    = mk_plugin_sched_get_thread_conf;

    /* Worker functions */
    api->worker_spawn = mk_utils_worker_spawn;
    api->worker_rename = mk_utils_worker_rename;

    /* Time functions */
    api->time_unix   = mk_plugin_time_now_unix;
    api->time_to_gmt = mk_utils_utime2gmt;
    api->time_human  = mk_plugin_time_now_human;

    api->stacktrace = (void *) mk_utils_stacktrace;
    api->kernel_version = mk_kernel_version;
    api->kernel_features_print = mk_kernel_features_print;
    api->plugins = &server->plugins;

    /* handler */
    api->handler_param_get = mk_handler_param_get;

    server->api = api;
}